

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

tests * lest::make_tests<lest::test[2]>(tests *__return_storage_ptr__,test (*c) [2])

{
  pointer ptVar1;
  pointer ptVar2;
  pointer ptVar3;
  test *in_RCX;
  vector<lest::test,_std::allocator<lest::test>_> local_38;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (&local_38,(lest *)c,c[1],in_RCX);
  ptVar3 = local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  ptVar2 = local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar1 = local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_start = ptVar1;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_finish = ptVar2;
  (__return_storage_ptr__->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = ptVar3;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }